

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend2.cpp
# Opt level: O0

void __thiscall Prog::run(Prog *this)

{
  bool bVar1;
  Dialog *in_RDI;
  undefined8 uVar2;
  Dialog *in_stack_00000010;
  bool in_stack_0000002f;
  Dialog *in_stack_00000030;
  Prog *in_stack_000003e0;
  
  Dialog::prepare(in_stack_00000010);
  while (bVar1 = Dialog::is_quit_requested(in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = Dialog::is_draw_requested(in_RDI);
    if (bVar1) {
      uVar2 = al_map_rgb(0x80,0x80);
      al_clear_to_color(uVar2);
      draw_samples(in_stack_000003e0);
      Dialog::draw(in_stack_00000010);
      al_flip_display();
    }
    Dialog::run_step(in_stack_00000030,in_stack_0000002f);
  }
  return;
}

Assistant:

void Prog::run()
{
   d.prepare();

   while (!d.is_quit_requested()) {
      if (d.is_draw_requested()) {
         al_clear_to_color(al_map_rgb(128, 128, 128));
         draw_samples();
         d.draw();
         al_flip_display();
      }

      d.run_step(true);
   }
}